

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantile_sort_tree.hpp
# Opt level: O0

timestamp_t __thiscall
duckdb::Interpolator<false>::
Interpolate<unsigned_long,duckdb::timestamp_t,duckdb::QuantileIndirect<duckdb::date_t>>
          (Interpolator<false> *this,unsigned_long lidx,unsigned_long hidx,Vector *result,
          QuantileIndirect<duckdb::date_t> *accessor)

{
  RESULT_TYPE RVar1;
  long in_RDX;
  long in_RSI;
  Vector *in_RDI;
  timestamp_t hi;
  timestamp_t lo;
  QuantileIndirect<duckdb::date_t> *in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffac;
  undefined8 local_8;
  
  if (in_RSI == in_RDX) {
    QuantileIndirect<duckdb::date_t>::operator()(in_stack_ffffffffffffff98,(INPUT_TYPE *)0xa81592);
    local_8 = CastInterpolation::Cast<duckdb::date_t,duckdb::timestamp_t>
                        ((date_t *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
                         in_RDI);
  }
  else {
    QuantileIndirect<duckdb::date_t>::operator()(in_stack_ffffffffffffff98,(INPUT_TYPE *)0xa815be);
    CastInterpolation::Cast<duckdb::date_t,duckdb::timestamp_t>
              ((date_t *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),in_RDI);
    RVar1 = QuantileIndirect<duckdb::date_t>::operator()
                      (in_stack_ffffffffffffff98,(INPUT_TYPE *)0xa815e5);
    CastInterpolation::Cast<duckdb::date_t,duckdb::timestamp_t>
              ((date_t *)CONCAT44(RVar1.days,in_stack_ffffffffffffffa8),in_RDI);
    local_8 = CastInterpolation::Interpolate<duckdb::timestamp_t>
                        ((timestamp_t *)CONCAT44(RVar1.days,in_stack_ffffffffffffffa8),
                         (double)in_RDI,(timestamp_t *)in_stack_ffffffffffffff98);
  }
  return (timestamp_t)local_8;
}

Assistant:

TARGET_TYPE Interpolate(INPUT_TYPE lidx, INPUT_TYPE hidx, Vector &result, const ACCESSOR &accessor) const {
		using ACCESS_TYPE = typename ACCESSOR::RESULT_TYPE;
		if (lidx == hidx) {
			return CastInterpolation::Cast<ACCESS_TYPE, TARGET_TYPE>(accessor(lidx), result);
		} else {
			auto lo = CastInterpolation::Cast<ACCESS_TYPE, TARGET_TYPE>(accessor(lidx), result);
			auto hi = CastInterpolation::Cast<ACCESS_TYPE, TARGET_TYPE>(accessor(hidx), result);
			return CastInterpolation::Interpolate<TARGET_TYPE>(lo, RN - FRN, hi);
		}
	}